

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

int passphrase_cb(char *buf,int size,int rwflag,char *passphrase)

{
  size_t sVar1;
  int iVar2;
  
  sVar1 = strlen(passphrase);
  iVar2 = size + -1;
  if ((int)sVar1 < size) {
    iVar2 = (int)sVar1;
  }
  memcpy(buf,passphrase,(long)iVar2);
  buf[iVar2] = '\0';
  return iVar2;
}

Assistant:

static int
passphrase_cb(char *buf, int size, int rwflag, char *passphrase)
{
    int passphrase_len = (int) strlen(passphrase);

    (void)rwflag;

    if(passphrase_len > (size - 1)) {
        passphrase_len = size - 1;
    }
    memcpy(buf, passphrase, passphrase_len);
    buf[passphrase_len] = '\0';

    return passphrase_len;
}